

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O2

cs_err X86_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  uint8_t *puVar1;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  X86_init(MRI);
  ud->printer = X86_Intel_printInst;
  ud->syntax = 1;
  ud->printer_info = MRI;
  ud->disasm = X86_getInstruction;
  ud->reg_name = X86_reg_name;
  ud->insn_id = X86_get_insn_id;
  ud->insn_name = X86_insn_name;
  ud->group_name = X86_group_name;
  ud->post_printer = (PostPrinter_t)0x0;
  ud->reg_access = X86_reg_access;
  if (ud->mode == CS_MODE_64) {
    puVar1 = "";
  }
  else {
    puVar1 = "";
  }
  ud->regsize_map = puVar1;
  return CS_ERR_OK;
}

Assistant:

cs_err X86_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	X86_init(mri);

	// by default, we use Intel syntax
	ud->printer = X86_Intel_printInst;
	ud->syntax = CS_OPT_SYNTAX_INTEL;
	ud->printer_info = mri;
	ud->disasm = X86_getInstruction;
	ud->reg_name = X86_reg_name;
	ud->insn_id = X86_get_insn_id;
	ud->insn_name = X86_insn_name;
	ud->group_name = X86_group_name;
	ud->post_printer = NULL;;
#ifndef CAPSTONE_DIET
	ud->reg_access = X86_reg_access;
#endif

	if (ud->mode == CS_MODE_64)
		ud->regsize_map = regsize_map_64;
	else
		ud->regsize_map = regsize_map_32;

	return CS_ERR_OK;
}